

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::tracker_response
          (torrent *this,tracker_request *r,address *tracker_ip,
          list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips,
          tracker_response *resp)

{
  pointer *this_00;
  session_interface *psVar1;
  long lVar2;
  long lVar3;
  i2p_connection *piVar4;
  address *paVar5;
  undefined4 uVar6;
  reference ppVar7;
  tracker_response *ptVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  torrent_info *this_01;
  info_hash_t *n;
  ulong uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar14;
  undefined4 extraout_var_01;
  vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_> *this_02
  ;
  reference c;
  char *pcVar15;
  vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
  *pvVar16;
  vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
  *pvVar17;
  torrent_peer *ptVar18;
  undefined8 uVar19;
  pointer ppVar20;
  undefined4 extraout_var_02;
  size_type sVar21;
  size_type sVar22;
  undefined4 extraout_var_03;
  undefined7 uVar23;
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  *args_2;
  address *addr;
  undefined1 auVar24 [16];
  string_view sVar25;
  string_view sVar26;
  span<const_char> s;
  uint local_6f0;
  bool local_641;
  int local_634;
  undefined1 local_630 [28];
  int peer_count;
  string local_600;
  reference local_5e0;
  ipv6_peer_entry *peer_1;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
  *__range3_3;
  string local_5b8;
  reference local_598;
  ipv4_peer_entry *peer;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
  *__range3_2;
  string str;
  address_v6 local_550;
  address local_538;
  undefined1 local_514 [8];
  endpoint a_2;
  ipv6_peer_entry *i_4;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
  *__range2_2;
  address local_4d0;
  undefined1 local_4ac [8];
  endpoint a_1;
  ipv4_peer_entry *i_3;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
  *__range2_1;
  undefined1 local_468 [6];
  bool need_update;
  pex_flags_t flags;
  object_type local_458;
  undefined1 local_448 [8];
  string destination;
  peer_entry p;
  torrent_state st_1;
  i2p_peer_entry *i_2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
  *__range3_1;
  code *local_310;
  size_type local_308;
  type local_300;
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  local_2d8;
  undefined1 local_2b3;
  pex_flags_t local_2b2;
  peer_source_flags_t local_2b1;
  string_view local_2b0;
  undefined1 local_2a0 [8];
  torrent_state st;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  string_view local_1d0;
  reference local_1c0;
  peer_entry *i_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *__range2;
  string local_180;
  string local_160;
  reference local_140;
  address *i;
  const_iterator __end3;
  const_iterator __begin3;
  list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *__range3;
  string resolved_to;
  undefined1 local_f8 [64];
  duration local_b8;
  duration local_b4;
  value_type *local_b0;
  value_type *a;
  announce_endpoint *aep;
  endpoint local_endpoint;
  announce_entry *ae;
  protocol_version v;
  time_point32 now;
  address local_50;
  tracker_response *local_30;
  tracker_response *resp_local;
  list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips_local;
  address *tracker_ip_local;
  tracker_request *r_local;
  torrent *this_local;
  
  local_30 = resp;
  resp_local = (tracker_response *)tracker_ips;
  tracker_ips_local =
       (list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)tracker_ip;
  tracker_ip_local = (address *)r;
  r_local = (tracker_request *)this;
  boost::asio::ip::address::address(&local_50);
  bVar9 = boost::asio::ip::operator!=(&resp->external_ip,&local_50);
  uVar23 = (undefined7)((ulong)tracker_ips >> 8);
  local_641 = false;
  if (bVar9) {
    bVar9 = boost::asio::ip::address::is_unspecified((address *)tracker_ips_local);
    local_641 = false;
    if (!bVar9) {
      local_641 = listen_socket_handle::operator_cast_to_bool
                            ((listen_socket_handle *)(tracker_ip_local + 7));
    }
  }
  if (local_641 != false) {
    psVar1 = (this->super_torrent_hot_members).m_ses;
    listen_socket_handle::get_local_endpoint
              ((endpoint *)&now,(listen_socket_handle *)(tracker_ip_local + 7));
    v = 8;
    uVar23 = 0;
    (*(psVar1->super_session_logger)._vptr_session_logger[2])
              (psVar1,&now,&local_30->external_ip,8,tracker_ips_local);
  }
  ae._4_4_ = time_now32();
  paVar5 = tracker_ip_local + 5;
  this_01 = torrent_file(this);
  n = torrent_info::info_hashes(this_01);
  bVar9 = digest32<160L>::operator==((digest32<160L> *)&(paVar5->ipv6_address_).scope_id_,&n->v1);
  args_2 = (function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
            *)CONCAT71(uVar23,bVar9);
  ae._3_1_ = !bVar9;
  local_endpoint.impl_.data_._20_8_ =
       tracker_list::find_tracker(&this->m_trackers,(string *)tracker_ip_local);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)((long)&aep + 4));
  if ((local_endpoint.impl_.data_._20_8_ != 0) &&
     (a = (value_type *)
          announce_entry::find_endpoint
                    ((announce_entry *)local_endpoint.impl_.data_._20_8_,
                     (listen_socket_handle *)(tracker_ip_local + 7)),
     (announce_endpoint *)a != (announce_endpoint *)0x0)) {
    local_b0 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
               ::operator[](&((announce_endpoint *)a)->info_hashes,ae._3_1_);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
              ((basic_endpoint<boost::asio::ip::tcp> *)((long)&aep + 4),
               (basic_endpoint<boost::asio::ip::tcp> *)a);
    if (-1 < local_30->incomplete) {
      local_b0->scrape_incomplete = local_30->incomplete;
    }
    if (-1 < local_30->complete) {
      local_b0->scrape_complete = local_30->complete;
    }
    if (-1 < local_30->downloaded) {
      local_b0->scrape_downloaded = local_30->downloaded;
    }
    if (((*(ushort *)&local_b0->field_0x44 >> 8 & 1) == 0) &&
       (*(char *)((long)&tracker_ip_local[3].ipv6_address_.scope_id_ + 2) == '\x02')) {
      *(ushort *)&local_b0->field_0x44 = *(ushort *)&local_b0->field_0x44 & 0xfeff | 0x100;
    }
    if (((*(ushort *)&local_b0->field_0x44 >> 9 & 1) == 0) &&
       (*(char *)((long)&tracker_ip_local[3].ipv6_address_.scope_id_ + 2) == '\x01')) {
      *(ushort *)&local_b0->field_0x44 = *(ushort *)&local_b0->field_0x44 | 0x200;
      this->field_0x606 = this->field_0x606 | 0x40;
    }
    *(byte *)(local_endpoint.impl_.data_._20_8_ + 0x6e) =
         *(byte *)(local_endpoint.impl_.data_._20_8_ + 0x6e) & 0xef | 0x10;
    local_b4.__r = (rep_conflict)
                   ::std::chrono::operator+
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                               *)((long)&ae + 4),&local_30->interval);
    (local_b0->next_announce).__d.__r = local_b4.__r;
    local_b8.__r = (rep_conflict)
                   ::std::chrono::operator+
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                               *)((long)&ae + 4),&local_30->min_interval);
    (local_b0->min_announce).__d.__r = local_b8.__r;
    uVar13 = (ulong)CONCAT22(SUB42(local_b8.__r,2),*(undefined2 *)&local_b0->field_0x44) &
             0xffffffffffffff7f;
    *(short *)&local_b0->field_0x44 = (short)uVar13;
    args_2 = (function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
              *)(CONCAT62((int6)(uVar13 >> 0x10),*(undefined2 *)&local_b0->field_0x44) &
                0xffffffffffffff80);
    *(short *)&local_b0->field_0x44 = (short)args_2;
    boost::system::error_code::clear(&local_b0->last_error);
    uVar13 = ::std::__cxx11::string::empty();
    if ((uVar13 & 1) == 0) {
      ::std::__cxx11::string::string
                ((string *)(local_f8 + 0x20),(string *)&local_30->warning_message);
    }
    else {
      ::std::__cxx11::string::string((string *)(local_f8 + 0x20));
    }
    ::std::__cxx11::string::operator=((string *)local_b0,(string *)(local_f8 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_f8 + 0x20));
    tracker_list::record_working
              (&this->m_trackers,(announce_entry *)local_endpoint.impl_.data_._20_8_);
    uVar13 = ::std::__cxx11::string::empty();
    if (((uVar13 & 1) == 0) &&
       (bVar9 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_endpoint.impl_.data_._20_8_ + 0x30),&local_30->trackerid
                                 ), bVar9)) {
      ::std::__cxx11::string::operator=
                ((string *)(local_endpoint.impl_.data_._20_8_ + 0x30),(string *)&local_30->trackerid
                );
      iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      bVar9 = alert_manager::should_post<libtorrent::trackerid_alert>
                        ((alert_manager *)CONCAT44(extraout_var,iVar12));
      if (bVar9) {
        iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_f8);
        args_2 = (function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)((long)&ae + 3);
        alert_manager::
        emplace_alert<libtorrent::trackerid_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::protocol_version_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar12),(torrent_handle *)local_f8,
                   (basic_endpoint<boost::asio::ip::tcp> *)a,(protocol_version *)args_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   tracker_ip_local,&local_30->trackerid);
        torrent_handle::~torrent_handle((torrent_handle *)local_f8);
      }
    }
    update_scrape_state(this);
  }
  resolved_to.field_2._12_4_ = ae._4_4_;
  update_tracker_timer(this,ae._4_4_);
  uVar10 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar10 & 1) != 0) {
    ::std::__cxx11::string::string((string *)&__range3);
    ptVar8 = resp_local;
    __end3 = ::std::__cxx11::
             list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::begin
                       ((list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *
                        )resp_local);
    i = (address *)
        ::std::__cxx11::list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
        end((list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)ptVar8);
    while (bVar9 = ::std::operator!=(&__end3,(_Self *)&i), bVar9) {
      local_140 = ::std::_List_const_iterator<boost::asio::ip::address>::operator*(&__end3);
      boost::asio::ip::address::to_string_abi_cxx11_(&local_160,local_140);
      ::std::__cxx11::string::operator+=((string *)&__range3,(string *)&local_160);
      ::std::__cxx11::string::~string((string *)&local_160);
      ::std::__cxx11::string::operator+=((string *)&__range3,", ");
      ::std::_List_const_iterator<boost::asio::ip::address>::operator++(&__end3);
    }
    uVar10 = ::std::chrono::duration<int,_std::ratio<1L,_1L>_>::count(&local_30->interval);
    uVar11 = ::std::chrono::duration<int,_std::ratio<1L,_1L>_>::count(&local_30->min_interval);
    print_address_abi_cxx11_(&local_180,(aux *)&local_30->external_ip,addr);
    uVar19 = ::std::__cxx11::string::c_str();
    auVar24 = ::std::__cxx11::string::c_str();
    print_address_abi_cxx11_((string *)&__range2,(aux *)tracker_ips_local,auVar24._8_8_);
    uVar14 = ::std::__cxx11::string::c_str();
    args_2 = (function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
              *)(ulong)uVar11;
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,
               "TRACKER RESPONSE [ interval: %d | min-interval: %d | external ip: %s | resolved to: %s | we connected to: %s ]"
               ,(ulong)uVar10,args_2,uVar19,auVar24._0_8_,uVar14);
    ::std::__cxx11::string::~string((string *)&__range2);
    ::std::__cxx11::string::~string((string *)&local_180);
    ::std::__cxx11::string::~string((string *)&__range3);
  }
  ptVar8 = local_30;
  __end2 = ::std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
           ::begin(&local_30->peers);
  i_1 = (peer_entry *)
        ::std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>::
        end(&ptVar8->peers);
  while( true ) {
    bVar9 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_libtorrent::aux::peer_entry_*,_std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>_>
                                *)&i_1);
    if (!bVar9) break;
    local_1c0 = __gnu_cxx::
                __normal_iterator<const_libtorrent::aux::peer_entry_*,_std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>_>
                ::operator*(&__end2);
    bVar9 = digest32<160L>::operator==(&local_1c0->pid,&this->m_peer_id);
    if (!bVar9) {
      lVar2._0_4_ = tracker_ip_local[8].type_;
      lVar2._4_4_ = tracker_ip_local[8].ipv4_address_;
      if (lVar2 == 0) {
        iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[8])();
        ppVar7 = local_1c0;
        local_2b3 = 2;
        local_310 = on_peer_name_lookup;
        local_308 = 0;
        ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                  ((enable_shared_from_this<libtorrent::aux::torrent> *)&__range3_1);
        ::std::
        bind<void(libtorrent::aux::torrent::*)(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int,libtorrent::protocol_version),std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>const&,std::_Placeholder<2>const&,unsigned_short_const&,libtorrent::protocol_version_const&>
                  (&local_300,(offset_in_torrent_to_subr *)&local_310,
                   (shared_ptr<libtorrent::aux::torrent> *)&__range3_1,
                   (_Placeholder<1> *)&::std::placeholders::_1,
                   (_Placeholder<2> *)&::std::placeholders::_2,&local_1c0->port,
                   (protocol_version *)((long)&ae + 3));
        ::std::
        function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
        ::
        function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>,std::_Placeholder<2>,unsigned_short,libtorrent::protocol_version))(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int,libtorrent::protocol_version)>,void>
                  ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
                    *)&local_2d8,&local_300);
        args_2 = &local_2d8;
        (*(code *)**(undefined8 **)CONCAT44(extraout_var_01,iVar12))
                  ((undefined8 *)CONCAT44(extraout_var_01,iVar12),ppVar7,local_2b3);
        ::std::
        function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
        ::~function(&local_2d8);
        ::std::
        _Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short,_libtorrent::protocol_version))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int,_libtorrent::protocol_version)>
        ::~_Bind(&local_300);
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)&__range3_1);
      }
      else {
        sVar25 = (string_view)
                 ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c0);
        local_1d0 = sVar25;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1e0,".i2p");
        sVar25._M_str = local_1e0._M_str;
        sVar25._M_len = local_1e0._M_len;
        args_2 = (function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)local_1e0._M_str;
        bVar9 = string_ends_with(local_1d0,sVar25);
        if (bVar9) {
          piVar4 = *(i2p_connection **)(tracker_ip_local + 8);
          pcVar15 = (char *)::std::__cxx11::string::c_str();
          this_00 = &st.erased.
                     super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                    ((enable_shared_from_this<libtorrent::aux::torrent> *)this_00);
          i2p_connection::
          async_name_lookup<libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0>
                    (piVar4,pcVar15,(anon_class_16_1_89917c4a_for_m_underlying_handler *)this_00);
          tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)
          ::$_0::~__0((__0 *)&st.erased.
                              super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          get_peer_list_state((torrent_state *)local_2a0,this);
          need_peer_list(this);
          ppVar20 = ::std::
                    unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                    ::operator->(&(this->super_torrent_hot_members).m_peer_list);
          sVar26 = (string_view)
                   ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c0);
          local_2b1.m_val = '\x01';
          local_2b0 = sVar26;
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
          bitfield_flag(&local_2b2);
          args_2 = (function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                    *)(ulong)local_2b1.m_val;
          ptVar18 = peer_list::add_i2p_peer
                              (ppVar20,local_2b0,local_2b1,local_2b2,(torrent_state *)local_2a0);
          if (ptVar18 != (torrent_peer *)0x0) {
            state_updated(this);
          }
          peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             *)&st.port);
          torrent_state::~torrent_state((torrent_state *)local_2a0);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_libtorrent::aux::peer_entry_*,_std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>_>
    ::operator++(&__end2);
  }
  lVar3._0_4_ = tracker_ip_local[8].type_;
  lVar3._4_4_ = tracker_ip_local[8].ipv4_address_;
  if (lVar3 != 0) {
    this_02 = &local_30->i2p_peers;
    __end3_1 = ::std::
               vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
               ::begin(this_02);
    i_2 = (i2p_peer_entry *)
          ::std::
          vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
          ::end(this_02);
    while( true ) {
      bVar9 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<const_libtorrent::aux::i2p_peer_entry_*,_std::vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>_>
                          *)&i_2);
      if (!bVar9) break;
      c = __gnu_cxx::
          __normal_iterator<const_libtorrent::aux::i2p_peer_entry_*,_std::vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>_>
          ::operator*(&__end3_1);
      get_peer_list_state((torrent_state *)(p.pid.m_number._M_elems + 4),this);
      peer_entry::peer_entry((peer_entry *)((long)&destination.field_2 + 8));
      span<char_const>::span<libtorrent::digest32<256l>,char,void>
                ((span<char_const> *)&local_458.__align,&c->destination);
      s.m_len = (difference_type)args_2;
      s.m_ptr = (char *)local_458._8_8_;
      base32encode_i2p_abi_cxx11_((string *)local_448,(libtorrent *)local_458.__align,s);
      ::std::__cxx11::string::operator+=((string *)local_448,".b32.i2p");
      piVar4 = *(i2p_connection **)(tracker_ip_local + 8);
      pcVar15 = (char *)::std::__cxx11::string::c_str();
      ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                ((enable_shared_from_this<libtorrent::aux::torrent> *)local_468);
      i2p_connection::
      async_name_lookup<libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__1>
                (piVar4,pcVar15,(anon_class_16_1_89917c4a_for_m_underlying_handler *)local_468);
      tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)
      ::$_1::~__1((__1 *)local_468);
      ::std::__cxx11::string::~string((string *)local_448);
      peer_entry::~peer_entry((peer_entry *)((long)&destination.field_2 + 8));
      torrent_state::~torrent_state((torrent_state *)(p.pid.m_number._M_elems + 4));
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::i2p_peer_entry_*,_std::vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>_>
      ::operator++(&__end3_1);
    }
  }
  if (ae._3_1_ == V2) {
    __range2_1._7_1_ = 0x80;
  }
  else {
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::bitfield_flag
              ((bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> *)
               ((long)&__range2_1 + 7),'\0');
  }
  __range2_1._6_1_ = 0;
  pvVar16 = &local_30->peers4;
  __end2_1 = ::std::
             vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
             ::begin(pvVar16);
  i_3 = (ipv4_peer_entry *)
        ::std::
        vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
        ::end(pvVar16);
  while( true ) {
    bVar9 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_libtorrent::aux::ipv4_peer_entry_*,_std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>_>
                        *)&i_3);
    if (!bVar9) break;
    a_1.impl_.data_._20_8_ =
         __gnu_cxx::
         __normal_iterator<const_libtorrent::aux::ipv4_peer_entry_*,_std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>_>
         ::operator*(&__end2_1);
    boost::asio::ip::address_v4::address_v4
              ((address_v4 *)((long)&__range2_2 + 4),(bytes_type *)a_1.impl_.data_._20_8_);
    boost::asio::ip::address::address(&local_4d0,(address_v4 *)((long)&__range2_2 + 4));
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)local_4ac,&local_4d0,
               *(unsigned_short *)(a_1.impl_.data_._20_8_ + 4));
    __range2_2._3_1_ = '\x01';
    __range2_2._2_1_ = __range2_1._7_1_;
    ptVar18 = add_peer(this,(endpoint *)local_4ac,(peer_source_flags_t)0x1,__range2_1._7_1_);
    __range2_1._6_1_ = (__range2_1._6_1_ & 1) != 0 || ptVar18 != (torrent_peer *)0x0;
    __gnu_cxx::
    __normal_iterator<const_libtorrent::aux::ipv4_peer_entry_*,_std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>_>
    ::operator++(&__end2_1);
  }
  pvVar17 = &local_30->peers6;
  __end2_2 = ::std::
             vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
             ::begin(pvVar17);
  i_4 = (ipv6_peer_entry *)
        ::std::
        vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
        ::end(pvVar17);
  while( true ) {
    bVar9 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<const_libtorrent::aux::ipv6_peer_entry_*,_std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>_>
                        *)&i_4);
    if (!bVar9) break;
    a_2.impl_.data_._20_8_ =
         __gnu_cxx::
         __normal_iterator<const_libtorrent::aux::ipv6_peer_entry_*,_std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>_>
         ::operator*(&__end2_2);
    boost::asio::ip::address_v6::address_v6(&local_550,(bytes_type *)a_2.impl_.data_._20_8_,0);
    boost::asio::ip::address::address(&local_538,&local_550);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)local_514,&local_538,
               *(unsigned_short *)(a_2.impl_.data_._20_8_ + 0x10));
    str.field_2._M_local_buf[0xf] = '\x01';
    str.field_2._M_local_buf[0xe] = __range2_1._7_1_;
    ptVar18 = add_peer(this,(endpoint *)local_514,(peer_source_flags_t)0x1,__range2_1._7_1_);
    __range2_1._6_1_ = (__range2_1._6_1_ & 1) != 0 || ptVar18 != (torrent_peer *)0x0;
    __gnu_cxx::
    __normal_iterator<const_libtorrent::aux::ipv6_peer_entry_*,_std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>_>
    ::operator++(&__end2_2);
  }
  uVar10 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar10 & 1) != 0) {
    bVar9 = ::std::
            vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
            ::empty(&local_30->peers4);
    if (bVar9) {
      bVar9 = ::std::
              vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
              ::empty(&local_30->peers6);
      if (bVar9) goto LAB_0067ca08;
    }
    ::std::__cxx11::string::string((string *)&__range3_2);
    pvVar16 = &local_30->peers4;
    __end3_2 = ::std::
               vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
               ::begin(pvVar16);
    peer = (ipv4_peer_entry *)
           ::std::
           vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
           ::end(pvVar16);
    while( true ) {
      bVar9 = __gnu_cxx::operator!=
                        (&__end3_2,
                         (__normal_iterator<const_libtorrent::aux::ipv4_peer_entry_*,_std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>_>
                          *)&peer);
      if (!bVar9) break;
      local_598 = __gnu_cxx::
                  __normal_iterator<const_libtorrent::aux::ipv4_peer_entry_*,_std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>_>
                  ::operator*(&__end3_2);
      boost::asio::ip::address_v4::address_v4((address_v4 *)((long)&__range3_3 + 4),&local_598->ip);
      boost::asio::ip::address_v4::to_string_abi_cxx11_
                (&local_5b8,(address_v4 *)((long)&__range3_3 + 4));
      ::std::__cxx11::string::operator+=((string *)&__range3_2,(string *)&local_5b8);
      ::std::__cxx11::string::~string((string *)&local_5b8);
      ::std::__cxx11::string::operator+=((string *)&__range3_2,' ');
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::ipv4_peer_entry_*,_std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>_>
      ::operator++(&__end3_2);
    }
    pvVar17 = &local_30->peers6;
    __end3_3 = ::std::
               vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
               ::begin(pvVar17);
    peer_1 = (ipv6_peer_entry *)
             ::std::
             vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
             ::end(pvVar17);
    while( true ) {
      bVar9 = __gnu_cxx::operator!=
                        (&__end3_3,
                         (__normal_iterator<const_libtorrent::aux::ipv6_peer_entry_*,_std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>_>
                          *)&peer_1);
      if (!bVar9) break;
      local_5e0 = __gnu_cxx::
                  __normal_iterator<const_libtorrent::aux::ipv6_peer_entry_*,_std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>_>
                  ::operator*(&__end3_3);
      boost::asio::ip::address_v6::address_v6((address_v6 *)(local_630 + 0x18),&local_5e0->ip,0);
      boost::asio::ip::address_v6::to_string_abi_cxx11_(&local_600,(address_v6 *)(local_630 + 0x18))
      ;
      ::std::__cxx11::string::operator+=((string *)&__range3_2,(string *)&local_600);
      ::std::__cxx11::string::~string((string *)&local_600);
      ::std::__cxx11::string::operator+=((string *)&__range3_2,' ');
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::ipv6_peer_entry_*,_std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>_>
      ::operator++(&__end3_3);
    }
    uVar19 = ::std::__cxx11::string::c_str();
    bVar9 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
    if (bVar9) {
      ppVar20 = ::std::
                unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                ::operator->(&(this->super_torrent_hot_members).m_peer_list);
      local_6f0 = peer_list::num_connect_candidates(ppVar20);
    }
    else {
      local_6f0 = 0xffffffff;
    }
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"tracker add_peer() [ %s] connect-candidates: %d",uVar19,(ulong)local_6f0);
    ::std::__cxx11::string::~string((string *)&__range3_2);
  }
LAB_0067ca08:
  if ((__range2_1._6_1_ & 1) != 0) {
    state_updated(this);
  }
  update_want_peers(this);
  iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [5])();
  bVar9 = alert_manager::should_post<libtorrent::tracker_reply_alert>
                    ((alert_manager *)CONCAT44(extraout_var_02,iVar12));
  if ((bVar9) || ((tracker_ip_local[7].ipv6_address_.addr_.__in6_u.__u6_addr8[9] & 1) != 0)) {
    sVar21 = ::std::
             vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>::size
                       (&local_30->peers);
    sVar22 = ::std::
             vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
             ::size(&local_30->peers4);
    local_630._20_4_ = (int)sVar21 + (int)sVar22;
    sVar21 = ::std::
             vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
             ::size(&local_30->i2p_peers);
    local_630._20_4_ = local_630._20_4_ + (int)sVar21;
    iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_630);
    uVar6 = local_630._20_4_;
    sVar21 = ::std::
             vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
             ::size(&local_30->peers6);
    local_634 = uVar6 + (int)sVar21;
    alert_manager::
    emplace_alert<libtorrent::tracker_reply_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int,libtorrent::protocol_version_const&,std::__cxx11::string_const&>
              ((alert_manager *)CONCAT44(extraout_var_03,iVar12),(torrent_handle *)local_630,
               (basic_endpoint<boost::asio::ip::tcp> *)((long)&aep + 4),&local_634,
               (protocol_version *)((long)&ae + 3),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tracker_ip_local
              );
    torrent_handle::~torrent_handle((torrent_handle *)local_630);
  }
  do_connect_boost(this);
  state_updated(this);
  return;
}

Assistant:

void torrent::tracker_response(
		tracker_request const& r
		, address const& tracker_ip // this is the IP we connected to
		, std::list<address> const& tracker_ips // these are all the IPs it resolved to
		, struct tracker_response const& resp)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;
		TORRENT_ASSERT(!(r.kind & tracker_request::scrape_request));

		// if the tracker told us what our external IP address is, record it with
		// out external IP counter (and pass along the IP of the tracker to know
		// who to attribute this vote to)
		if (resp.external_ip != address() && !tracker_ip.is_unspecified() && r.outgoing_socket)
			m_ses.set_external_address(r.outgoing_socket.get_local_endpoint()
				, resp.external_ip
				, aux::session_interface::source_tracker, tracker_ip);

		time_point32 const now = aux::time_now32();

		protocol_version const v = r.info_hash == torrent_file().info_hashes().v1
			? protocol_version::V1 : protocol_version::V2;

		// TODO: move this into a function on tracker_list
		aux::announce_entry* ae = m_trackers.find_tracker(r.url);

		tcp::endpoint local_endpoint;
		if (ae)
		{
			auto* aep = ae->find_endpoint(r.outgoing_socket);
			if (aep)
			{
				auto& a = aep->info_hashes[v];

				local_endpoint = aep->local_endpoint;
				if (resp.incomplete >= 0) a.scrape_incomplete = resp.incomplete;
				if (resp.complete >= 0) a.scrape_complete = resp.complete;
				if (resp.downloaded >= 0) a.scrape_downloaded = resp.downloaded;
				if (!a.start_sent && r.event == event_t::started)
					a.start_sent = true;
				if (!a.complete_sent && r.event == event_t::completed)
				{
					a.complete_sent = true;
					// we successfully reported event=completed to one tracker. Don't
					// send it to any other ones from now on (there may be other
					// announces outstanding right now though)
					m_complete_sent = true;
				}
				ae->verified = true;
				a.next_announce = now + resp.interval;
				a.min_announce = now + resp.min_interval;
				a.updating = false;
				a.fails = 0;
				a.last_error.clear();
				a.message = !resp.warning_message.empty() ? resp.warning_message : std::string();
				m_trackers.record_working(ae);

				if ((!resp.trackerid.empty()) && (ae->trackerid != resp.trackerid))
				{
					ae->trackerid = resp.trackerid;
					if (m_ses.alerts().should_post<trackerid_alert>())
						m_ses.alerts().emplace_alert<trackerid_alert>(get_handle()
							, aep->local_endpoint, v, r.url, resp.trackerid);
				}

				update_scrape_state();
			}
		}
		update_tracker_timer(now);

#if TORRENT_ABI_VERSION == 1
		if (resp.complete >= 0 && resp.incomplete >= 0)
			m_last_scrape = aux::time_now32();
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			std::string resolved_to;
			for (auto const& i : tracker_ips)
			{
				resolved_to += i.to_string();
				resolved_to += ", ";
			}
			debug_log("TRACKER RESPONSE [ interval: %d | min-interval: %d | "
				"external ip: %s | resolved to: %s | we connected to: %s ]"
				, resp.interval.count()
				, resp.min_interval.count()
				, print_address(resp.external_ip).c_str()
				, resolved_to.c_str()
				, print_address(tracker_ip).c_str());
		}
#else
		TORRENT_UNUSED(tracker_ips);
#endif

		// for each of the peers we got from the tracker
		for (auto const& i : resp.peers)
		{
			// don't make connections to ourself
			if (i.pid == m_peer_id)
				continue;

#if TORRENT_USE_I2P
			if (r.i2pconn)
			{
				// this is an i2p name, we need to use the SAM connection
				// to do the name lookup
				if (string_ends_with(i.hostname, ".i2p"))
				{
					ADD_OUTSTANDING_ASYNC("torrent::on_i2p_resolve");
					r.i2pconn->async_name_lookup(i.hostname.c_str()
						, [self = shared_from_this()] (error_code const& ec, char const* dest)
						{ self->torrent::on_i2p_resolve(ec, dest); });
				}
				else
				{
					torrent_state st = get_peer_list_state();
					need_peer_list();
					if (m_peer_list->add_i2p_peer(i.hostname, peer_info::tracker, {}, &st))
						state_updated();
					peers_erased(st.erased);
				}
			}
			else
#endif
			{
				ADD_OUTSTANDING_ASYNC("torrent::on_peer_name_lookup");
				m_ses.get_resolver().async_resolve(i.hostname, aux::resolver_interface::abort_on_shutdown
					, std::bind(&torrent::on_peer_name_lookup, shared_from_this(), _1, _2, i.port, v));
			}
		}

#if TORRENT_USE_I2P
		if (r.i2pconn)
		{
			for (auto const& i : resp.i2p_peers)
			{
				torrent_state st = get_peer_list_state();
				peer_entry p;
				std::string destination = base32encode_i2p(i.destination);
				destination += ".b32.i2p";

				ADD_OUTSTANDING_ASYNC("torrent::on_i2p_resolve");
				r.i2pconn->async_name_lookup(destination.c_str()
					, [self = shared_from_this()] (error_code const& ec, char const* dest)
					{ self->torrent::on_i2p_resolve(ec, dest); });
			}
		}
#endif

		// there are 2 reasons to allow local IPs to be returned from a
		// non-local tracker
		// 1. retrackers are popular in russia, where an ISP runs a tracker within
		//    the AS (but not on the local network) giving out peers only from the
		//    local network
		// 2. it might make sense to have a tracker extension in the future where
		//    trackers records a peer's internal and external IP, and match up
		//    peers on the same local network

		pex_flags_t flags = v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0);

		bool need_update = false;
		for (auto const& i : resp.peers4)
		{
			tcp::endpoint const a(address_v4(i.ip), i.port);
			need_update |= bool(add_peer(a, peer_info::tracker, flags) != nullptr);
		}

		for (auto const& i : resp.peers6)
		{
			tcp::endpoint const a(address_v6(i.ip), i.port);
			need_update |= bool(add_peer(a, peer_info::tracker, flags) != nullptr);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log() && (!resp.peers4.empty() || !resp.peers6.empty()))
		{
			std::string str;
			for (auto const& peer : resp.peers4)
			{
				str += address_v4(peer.ip).to_string();
				str += ' ';
			}
			for (auto const& peer : resp.peers6)
			{
				str += address_v6(peer.ip).to_string();
				str += ' ';
			}
			debug_log("tracker add_peer() [ %s] connect-candidates: %d"
				, str.c_str(), m_peer_list
				? m_peer_list->num_connect_candidates() : -1);
		}
#endif
		if (need_update) state_updated();

		update_want_peers();

		// post unconditionally if the announce was triggered manually
		if (m_ses.alerts().should_post<tracker_reply_alert>()
			|| r.triggered_manually)
		{
			int peer_count = int(resp.peers.size() + resp.peers4.size());
#if TORRENT_USE_I2P
			peer_count += int(resp.i2p_peers.size());
#endif
			m_ses.alerts().emplace_alert<tracker_reply_alert>(
				get_handle(), local_endpoint, peer_count
				+ int(resp.peers6.size()), v, r.url);
		}

		do_connect_boost();

		state_updated();
	}